

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregoimp.cpp
# Opt level: O2

int32_t icu_63::Grego::dayOfWeekInMonth(int32_t year,int32_t month,int32_t dom)

{
  int8_t iVar1;
  int iVar2;
  
  if (dom - 0x16U < 7) {
    iVar1 = monthLength(year,month);
    iVar2 = (uint)(dom + 7 <= (int)iVar1) * 5 + -1;
  }
  else {
    iVar2 = -1;
    if (6 < dom - 0x1dU) {
      iVar2 = (dom + 6) / 7;
    }
  }
  return iVar2;
}

Assistant:

int32_t Grego::dayOfWeekInMonth(int32_t year, int32_t month, int32_t dom) {
    int32_t weekInMonth = (dom + 6)/7;
    if (weekInMonth == 4) {
        if (dom + 7 > monthLength(year, month)) {
            weekInMonth = -1;
        }
    } else if (weekInMonth == 5) {
        weekInMonth = -1;
    }
    return weekInMonth;
}